

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QRect __thiscall QAccessibleTabButton::rect(QAccessibleTabButton *this)

{
  char cVar1;
  QPoint QVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x10))();
  if (cVar1 == '\0') {
    uVar4 = 0xffffffffffffffff;
    uVar3 = 0;
  }
  else {
    local_20.xp.m_i = 0;
    local_20.yp.m_i = 0;
    QVar2 = QWidget::mapToGlobal((QWidget *)(this->m_parent).wp.value,&local_20);
    QVar5 = QTabBar::tabRect((QTabBar *)(this->m_parent).wp.value,this->m_index);
    uVar3 = (ulong)(uint)(QVar5.x1.m_i.m_i + QVar2.xp.m_i.m_i) |
            ((ulong)QVar2 & 0xffffffff00000000) + QVar5._0_8_ & 0xffffffff00000000;
    uVar4 = (ulong)(uint)(QVar5.x2.m_i.m_i + QVar2.xp.m_i.m_i) |
            (QVar5._8_8_ & 0xffffffff00000000) + (long)QVar2 & 0xffffffff00000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar5.x2.m_i = (int)uVar4;
    QVar5.y2.m_i = (int)(uVar4 >> 0x20);
    QVar5.x1.m_i = (int)uVar3;
    QVar5.y1.m_i = (int)(uVar3 >> 0x20);
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QRect rect() const override {
        if (!isValid())
            return QRect();

        QPoint tp = m_parent->mapToGlobal(QPoint(0,0));
        QRect rec = m_parent->tabRect(m_index);
        rec = QRect(tp.x() + rec.x(), tp.y() + rec.y(), rec.width(), rec.height());
        return rec;
    }